

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stat_cache.cpp
# Opt level: O3

int64_t __thiscall
libtorrent::aux::stat_cache::get_filesize
          (stat_cache *this,file_index_t i,file_storage *fs,string *save_path,error_code *ec)

{
  pointer peVar1;
  error_category *peVar2;
  bool bVar3;
  undefined3 uVar4;
  file_flags_t fVar5;
  int iVar6;
  pointer psVar7;
  long lVar8;
  string file_path;
  file_status s;
  string local_78;
  file_status local_58;
  
  fVar5 = file_storage::file_flags(fs,i);
  if ((fVar5.m_val & 8) == 0) {
    iVar6 = pthread_mutex_lock((pthread_mutex_t *)this);
    if (iVar6 != 0) {
      ::std::__throw_system_error(iVar6);
    }
    psVar7 = (this->m_stat_cache).
             super_vector<libtorrent::aux::stat_cache::stat_cache_t,_std::allocator<libtorrent::aux::stat_cache::stat_cache_t>_>
             .
             super__Vector_base<libtorrent::aux::stat_cache::stat_cache_t,_std::allocator<libtorrent::aux::stat_cache::stat_cache_t>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((int)((ulong)((long)(this->m_stat_cache).
                            super_vector<libtorrent::aux::stat_cache::stat_cache_t,_std::allocator<libtorrent::aux::stat_cache::stat_cache_t>_>
                            .
                            super__Vector_base<libtorrent::aux::stat_cache::stat_cache_t,_std::allocator<libtorrent::aux::stat_cache::stat_cache_t>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)psVar7) >> 3) <=
        i.m_val) {
      local_58.file_size = -1;
      ::std::
      vector<libtorrent::aux::stat_cache::stat_cache_t,_std::allocator<libtorrent::aux::stat_cache::stat_cache_t>_>
      ::resize(&(this->m_stat_cache).
                super_vector<libtorrent::aux::stat_cache::stat_cache_t,_std::allocator<libtorrent::aux::stat_cache::stat_cache_t>_>
               ,(long)(i.m_val + 1),(value_type *)&local_58);
      psVar7 = (this->m_stat_cache).
               super_vector<libtorrent::aux::stat_cache::stat_cache_t,_std::allocator<libtorrent::aux::stat_cache::stat_cache_t>_>
               .
               super__Vector_base<libtorrent::aux::stat_cache::stat_cache_t,_std::allocator<libtorrent::aux::stat_cache::stat_cache_t>_>
               ._M_impl.super__Vector_impl_data._M_start;
    }
    lVar8 = psVar7[i.m_val].file_size;
    if (lVar8 < -1) {
      peVar1 = (this->m_errors).
               super__Vector_base<boost::system::error_code,_std::allocator<boost::system::error_code>_>
               ._M_impl.super__Vector_impl_data._M_start + (-2 - lVar8);
      bVar3 = peVar1->failed_;
      uVar4 = *(undefined3 *)&peVar1->field_0x5;
      peVar2 = peVar1->cat_;
      ec->val_ = peVar1->val_;
      ec->failed_ = bVar3;
      *(undefined3 *)&ec->field_0x5 = uVar4;
      ec->cat_ = peVar2;
      lVar8 = -2;
    }
    else if (lVar8 == -1) {
      local_58.mtime = 0;
      local_58.ctime = 0;
      local_58.file_size = 0;
      local_58.atime = 0;
      local_58.mode.m_val = 0;
      file_storage::file_path(&local_78,fs,i,save_path);
      stat_file(&local_78,&local_58,ec,(file_status_flag_t)0x0);
      if (ec->failed_ == true) {
        set_error_impl(this,i,ec);
        lVar8 = -2;
      }
      else {
        set_cache_impl(this,i,local_58.file_size);
        lVar8 = local_58.file_size;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
      }
    }
    pthread_mutex_unlock((pthread_mutex_t *)this);
  }
  else {
    ec->val_ = 2;
    ec->failed_ = true;
    ec->cat_ = &boost::system::detail::cat_holder<void>::system_category_instance.
                super_error_category;
    lVar8 = -1;
  }
  return lVar8;
}

Assistant:

std::int64_t stat_cache::get_filesize(file_index_t const i, file_storage const& fs
		, std::string const& save_path, error_code& ec)
	{
		// always pretend symlinks don't exist, to trigger special logic for
		// creating and possibly validating them. There's a risk we'll and up in a
		// cycle of references here otherwise.
		// Should stat_file() be changed to use lstat()?
		if (fs.file_flags(i) & file_storage::flag_symlink)
		{
			ec.assign(boost::system::errc::no_such_file_or_directory, boost::system::system_category());
			return -1;
		}

		std::lock_guard<std::mutex> l(m_mutex);
		TORRENT_ASSERT(i < fs.end_file());
		if (i >= m_stat_cache.end_index()) m_stat_cache.resize(static_cast<int>(i) + 1
			, stat_cache_t{not_in_cache});
		std::int64_t sz = m_stat_cache[i].file_size;
		if (sz < not_in_cache)
		{
			ec = m_errors[std::size_t(-sz + file_error)];
			return file_error;
		}
		else if (sz == not_in_cache)
		{
			// query the filesystem
			file_status s;
			std::string const file_path = fs.file_path(i, save_path);
			stat_file(file_path, &s, ec);
			if (ec)
			{
				set_error_impl(i, ec);
				sz = file_error;
			}
			else
			{
				set_cache_impl(i, s.file_size);
				sz = s.file_size;
			}
		}
		return sz;
	}